

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O1

vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> * __thiscall
van_kampen::Diagramm::getCircuit
          (vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
           *__return_storage_ptr__,Diagramm *this)

{
  _Elt_pointer pNVar1;
  bool bVar2;
  nodeId_t nVar3;
  deque<van_kampen::Node,_std::allocator<van_kampen::Node>_> *pdVar4;
  deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *pdVar5;
  invalid_argument *this_00;
  ulong uVar6;
  int iVar7;
  long lVar8;
  _Elt_pointer pTVar9;
  Node *pNVar10;
  vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *pvVar11;
  vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> local_58;
  vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *local_38;
  
  local_58.super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = Node::isNonexistantNode(this->terminal_);
  pvVar11 = __return_storage_ptr__;
  if (!bVar2) {
    pdVar4 = Graph::nodes((this->graph_).
                          super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pNVar1 = (pdVar4->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar6 = ((long)pNVar1 -
             (long)(pdVar4->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                   _M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x2c8590b21642c859 +
            (long)this->terminal_;
    if (uVar6 < 2) {
      pNVar10 = pNVar1 + this->terminal_;
    }
    else {
      pNVar10 = (pdVar4->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                _M_impl.super__Deque_impl_data._M_start._M_node[uVar6 >> 1] +
                uVar6 + (uVar6 >> 1) * -2;
    }
    local_38 = __return_storage_ptr__;
    nVar3 = Node::getId(pNVar10);
    iVar7 = nVar3;
    do {
      pdVar4 = Graph::nodes((this->graph_).
                            super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           );
      lVar8 = (long)iVar7;
      pNVar1 = (pdVar4->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar6 = ((long)pNVar1 -
               (long)(pdVar4->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>
                     )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x2c8590b21642c859
              + lVar8;
      if (uVar6 < 2) {
        pNVar10 = pNVar1 + lVar8;
      }
      else {
        pNVar10 = (pdVar4->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_node[uVar6 >> 1] +
                  uVar6 + (uVar6 >> 1) * -2;
      }
      pdVar5 = Node::transitions(pNVar10);
      if ((pdVar5->
          super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (pdVar5->
          super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"diagram is not looped");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pdVar4 = Graph::nodes((this->graph_).
                            super___shared_ptr<van_kampen::Graph,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           );
      pNVar1 = (pdVar4->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      uVar6 = ((long)pNVar1 -
               (long)(pdVar4->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>
                     )._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x2c8590b21642c859
              + lVar8;
      if (uVar6 < 2) {
        pNVar10 = pNVar1 + lVar8;
      }
      else {
        pNVar10 = (pdVar4->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                  _M_impl.super__Deque_impl_data._M_start._M_node[uVar6 >> 1] +
                  uVar6 + (uVar6 >> 1) * -2;
      }
      pdVar5 = Node::transitions(pNVar10);
      pTVar9 = (pdVar5->
               super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pTVar9 == (pdVar5->
                    super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                    )._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pTVar9 = (pdVar5->
                 super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>)
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 7;
      }
      std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::push_back
                (&local_58,pTVar9 + -1);
      iVar7 = local_58.
              super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1].to;
    } while (iVar7 != nVar3);
    (local_38->super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_58.
         super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>._M_impl
         .super__Vector_impl_data._M_start;
    (local_38->super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>._M_impl
         .super__Vector_impl_data._M_finish;
    (local_38->super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_58.
         super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    __return_storage_ptr__ = local_38;
    pvVar11 = &local_58;
  }
  (pvVar11->super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar11->super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar11->super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Transition> Diagramm::getCircuit()
{
    std::vector<Transition> result{};

    if (Node::isNonexistantNode(terminal_))
    {
        return {};
    }

    nodeId_t firstNodeId = graph_->nodes()[terminal_].getId();
    nodeId_t curNodeId = firstNodeId;
    do
    {
        if (graph_->nodes()[curNodeId].transitions().empty())
        {
            throw std::invalid_argument("diagram is not looped");
        }
        else
        {
            result.push_back(graph_->nodes()[curNodeId].transitions().back());
            curNodeId = result.back().to;
        }
    } while (curNodeId != firstNodeId);

    return result;
}